

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::applyUnknownInvocationToScope(CheckerVisitor *this)

{
  VarScope *pVVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  
  for (pVVar1 = this->currentScope; pVVar1 != (VarScope *)0x0; pVVar1 = pVVar1->parent) {
    for (p_Var3 = (pVVar1->symbols)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
        p_Var3 = p_Var3->_M_nxt) {
      p_Var2 = (p_Var3[2]._M_nxt)->_M_nxt;
      if (*(int *)&p_Var2[1]._M_nxt == 4) {
        if (this->currentInfo != (FunctionInfo *)0x0) {
          FunctionInfo::addModifiable
                    (this->currentInfo,(SQChar *)p_Var3[1]._M_nxt,
                     (FunctionDecl *)p_Var2[2]._M_nxt[1]._M_nxt);
        }
        p_Var2 = p_Var3[2]._M_nxt;
        if (*(int *)&p_Var2->_M_nxt[1]._M_nxt == 4) {
          *(undefined4 *)&p_Var2[1]._M_nxt = 4;
          p_Var2[2]._M_nxt = (_Hash_node_base *)0x0;
        }
        p_Var2[9]._M_nxt = (_Hash_node_base *)0x0;
        *(undefined4 *)&p_Var2[7]._M_nxt = 0;
        *(undefined4 *)&p_Var2[5]._M_nxt = 0;
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::applyUnknownInvocationToScope() {
  VarScope *s = currentScope;

  while (s) {
    auto &symbols = s->symbols;
    for (auto &sym : symbols) {
      if (sym.second->isConstant())
        continue;
      if (currentInfo) {
        currentInfo->addModifiable(sym.first, sym.second->info->ownedScope->owner);
      }
      sym.second->kill();
    }
    s = s->parent;
  }
}